

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_reverse.c
# Opt level: O0

void linkedlist_reverse(s_linkedlist *linked_list)

{
  s_linkedlist_node *local_20;
  s_linkedlist_node *back;
  s_linkedlist_node *front;
  s_linkedlist *linked_list_local;
  
  local_20 = linked_list->tail;
  for (back = linked_list->head; back != local_20; back = back->next) {
    linkedlistnode_swap(back,local_20);
    local_20 = local_20->previous;
  }
  return;
}

Assistant:

void linkedlist_reverse(s_linkedlist *linked_list) {
    s_linkedlist_node *front = linked_list->head;
    s_linkedlist_node *back  = linked_list->tail;

    while (front != back) {
        linkedlistnode_swap(front, back);

        front = front->next;
        back  = back->previous;
    }
}